

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O0

void __thiscall prometheus::detail::CKMSQuantiles::compress(CKMSQuantiles *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  size_type sVar6;
  reference pvVar7;
  double dVar8;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_40;
  __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
  local_38;
  const_iterator local_30;
  size_type local_28;
  size_t next;
  size_t prev;
  size_t idx;
  CKMSQuantiles *this_local;
  
  idx = (size_t)this;
  sVar5 = std::
          vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
          ::size(&this->sample_);
  if (1 < sVar5) {
    prev = 1;
    local_28 = 0;
    while (sVar4 = prev,
          sVar6 = std::
                  vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                  ::size(&this->sample_), sVar5 = local_28, sVar4 < sVar6) {
      next = local_28;
      local_28 = prev;
      prev = prev + 1;
      pvVar7 = std::
               vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
               ::operator[](&this->sample_,sVar5);
      iVar1 = pvVar7->g;
      pvVar7 = std::
               vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
               ::operator[](&this->sample_,local_28);
      iVar2 = pvVar7->g;
      pvVar7 = std::
               vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
               ::operator[](&this->sample_,local_28);
      iVar3 = pvVar7->delta;
      dVar8 = allowableError(this,(int)prev + -1);
      if ((double)(iVar1 + iVar2 + iVar3) <= dVar8) {
        pvVar7 = std::
                 vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ::operator[](&this->sample_,next);
        iVar1 = pvVar7->g;
        pvVar7 = std::
                 vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ::operator[](&this->sample_,local_28);
        pvVar7->g = iVar1 + pvVar7->g;
        local_40._M_current =
             (Item *)std::
                     vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                     ::begin(&this->sample_);
        local_38 = __gnu_cxx::
                   __normal_iterator<prometheus::detail::CKMSQuantiles::Item_*,_std::vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>_>
                   ::operator+(&local_40,next);
        __gnu_cxx::
        __normal_iterator<prometheus::detail::CKMSQuantiles::Item_const*,std::vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>>
        ::__normal_iterator<prometheus::detail::CKMSQuantiles::Item*>
                  ((__normal_iterator<prometheus::detail::CKMSQuantiles::Item_const*,std::vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>>
                    *)&local_30,&local_38);
        std::
        vector<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
        ::erase(&this->sample_,local_30);
      }
    }
  }
  return;
}

Assistant:

void CKMSQuantiles::compress() {
  if (sample_.size() < 2) {
    return;
  }

  std::size_t idx = 0;
  std::size_t prev;
  std::size_t next = idx++;

  while (idx < sample_.size()) {
    prev = next;
    next = idx++;

    if (sample_[prev].g + sample_[next].g + sample_[next].delta <=
        allowableError(idx - 1)) {
      sample_[next].g += sample_[prev].g;
      sample_.erase(sample_.begin() + prev);
    }
  }
}